

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O3

void __thiscall
jrtplib::RTPSources::Timeout(RTPSources *this,RTPTime *curtime,RTPTime *timeoutdelay)

{
  RTPTime *pRVar1;
  RTPInternalSourceData *pRVar2;
  HashElement *pHVar3;
  HashElement *pHVar4;
  RTPMemoryManager *pRVar5;
  _func_int **pp_Var6;
  HashElement *pHVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  double dVar12;
  
  dVar12 = curtime->m_t - timeoutdelay->m_t;
  pHVar7 = (this->sourcelist).firsthashelem;
  (this->sourcelist).curhashelem = pHVar7;
  if (pHVar7 == (HashElement *)0x0) {
    iVar10 = 0;
    iVar9 = 0;
    iVar11 = 0;
  }
  else {
    iVar11 = 0;
    iVar9 = 0;
    iVar10 = 0;
    do {
      pRVar2 = pHVar7->element;
      if ((pRVar2 == this->owndata) ||
         (pRVar1 = &(pRVar2->super_RTPSourceData).stats.lastmsgtime,
         dVar12 < pRVar1->m_t || dVar12 == pRVar1->m_t)) {
        iVar11 = iVar11 + 1;
        iVar10 = iVar10 + (uint)(pRVar2->super_RTPSourceData).issender;
        uVar8 = (pRVar2->super_RTPSourceData).receivedbye ^ 1;
        if ((pRVar2->super_RTPSourceData).validated == false) {
          uVar8 = 0;
        }
        iVar9 = iVar9 + uVar8;
        pHVar7 = pHVar7->listnext;
        (this->sourcelist).curhashelem = pHVar7;
      }
      else {
        this->totalcount = this->totalcount + -1;
        if ((pRVar2->super_RTPSourceData).issender == true) {
          this->sendercount = this->sendercount + -1;
        }
        if (((pRVar2->super_RTPSourceData).validated == true) &&
           (((pRVar2->super_RTPSourceData).receivedbye & 1U) == 0)) {
          this->activecount = this->activecount + -1;
        }
        pHVar3 = pHVar7->hashprev;
        pHVar4 = pHVar7->hashnext;
        if (pHVar3 == (HashElement *)0x0) {
          (this->sourcelist).table[pHVar7->hashindex] = pHVar4;
        }
        else {
          pHVar3->hashnext = pHVar4;
        }
        if (pHVar4 != (HashElement *)0x0) {
          pHVar4->hashprev = pHVar3;
        }
        pHVar7 = (this->sourcelist).curhashelem;
        pHVar3 = pHVar7->listprev;
        pHVar4 = pHVar7->listnext;
        if (pHVar3 == (HashElement *)0x0) {
          (this->sourcelist).firsthashelem = pHVar4;
          if (pHVar4 == (HashElement *)0x0) {
            (this->sourcelist).lasthashelem = (HashElement *)0x0;
          }
          else {
            pHVar4->listprev = (HashElement *)0x0;
          }
        }
        else {
          pHVar3->listnext = pHVar4;
          if (pHVar4 == (HashElement *)0x0) {
            (this->sourcelist).lasthashelem = pHVar3;
          }
          else {
            pHVar4->listprev = pHVar3;
          }
        }
        pRVar5 = (this->sourcelist).super_RTPMemoryObject.mgr;
        if (pRVar5 == (RTPMemoryManager *)0x0) {
          operator_delete(pHVar7,0x30);
        }
        else {
          (**(code **)(*(long *)pRVar5 + 0x18))(pRVar5,pHVar7);
        }
        (this->sourcelist).curhashelem = pHVar4;
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[8])(this,pRVar2);
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[7])(this,pRVar2);
        pRVar5 = (this->super_RTPMemoryObject).mgr;
        pp_Var6 = (pRVar2->super_RTPSourceData).super_RTPMemoryObject._vptr_RTPMemoryObject;
        if (pRVar5 == (RTPMemoryManager *)0x0) {
          (*pp_Var6[1])(pRVar2);
        }
        else {
          (**pp_Var6)(pRVar2);
          (**(code **)(*(long *)pRVar5 + 0x18))(pRVar5,pRVar2);
        }
        pHVar7 = (this->sourcelist).curhashelem;
      }
    } while (pHVar7 != (HashElement *)0x0);
  }
  this->totalcount = iVar11;
  this->sendercount = iVar10;
  this->activecount = iVar9;
  return;
}

Assistant:

void RTPSources::Timeout(const RTPTime &curtime,const RTPTime &timeoutdelay)
{
	int newtotalcount = 0;
	int newsendercount = 0;
	int newactivecount = 0;
	RTPTime checktime = curtime;
	checktime -= timeoutdelay;
	
	sourcelist.GotoFirstElement();
	while (sourcelist.HasCurrentElement())
	{
		RTPInternalSourceData *srcdat = sourcelist.GetCurrentElement();
		RTPTime lastmsgtime = srcdat->INF_GetLastMessageTime();

		// we don't want to time out ourselves
		if ((srcdat != owndata) && (lastmsgtime < checktime)) // timeout
		{
			
			totalcount--;
			if (srcdat->IsSender())
				sendercount--;
			if (srcdat->IsActive())
				activecount--;
			
			sourcelist.DeleteCurrentElement();

			OnTimeout(srcdat);
			OnRemoveSource(srcdat);
			RTPDelete(srcdat,GetMemoryManager());
		}
		else
		{
			newtotalcount++;
			if (srcdat->IsSender())
				newsendercount++;
			if (srcdat->IsActive())
				newactivecount++;
			sourcelist.GotoNextElement();
		}
	}
	
#ifdef RTPDEBUG
	if (newtotalcount != totalcount)
	{
		std::cout << "New total count " << newtotalcount << " doesnt match old total count " << totalcount << std::endl;
		SafeCountTotal();
	}
	if (newsendercount != sendercount)
	{
		std::cout << "New sender count " << newsendercount << " doesnt match old sender count " << sendercount << std::endl;
		SafeCountSenders();
	}
	if (newactivecount != activecount)
	{
		std::cout << "New active count " << newactivecount << " doesnt match old active count " << activecount << std::endl;
		SafeCountActive();
	}
#endif // RTPDEBUG
	
	totalcount = newtotalcount; // just to play it safe
	sendercount = newsendercount;
	activecount = newactivecount;
}